

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_MeshParameters::Write(ON_MeshParameters *this,ON_BinaryArchive *file)

{
  bool bVar1;
  uint i;
  ON_SubDDisplayParameters subdp;
  ON_SubDDisplayParameters local_60;
  
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,5);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bComputeCurvature);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bSimplePlanes);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bRefine);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_bJaggedSeams);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,0);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_tolerance);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_min_edge_length);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_max_edge_length);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_grid_aspect_ratio);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_grid_min_count);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,this->m_grid_max_count);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_grid_angle_radians);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_grid_amplification);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_refine_angle_radians);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,0.08726646259971647);
    }
    i = (uint)this->m_face_type;
    if (2 < this->m_face_type) {
      i = 0;
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0x1e67,"","ON_MeshParameters::Write() - m_face_type out of bounds.");
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,i);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteInt(file,(uint)this->m_texture_range);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteBool(file,this->m_bCustomSettings);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_relative_tolerance);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteChar(file,this->m_mesher);
    }
    if (bVar1 != false) {
      bVar1 = ON_BinaryArchive::WriteBool(file,this->m_bCustomSettingsEnabled);
    }
    if (bVar1 != false) {
      ON_SubDDisplayParameters::DecodeFromUnsignedChar
                (&local_60,this->m_subd_mesh_parameters_as_char);
      bVar1 = ON_SubDDisplayParameters::Write(&local_60,file);
    }
  }
  return bVar1;
}

Assistant:

bool ON_MeshParameters::Write( ON_BinaryArchive& file ) const
{
  int minor_version = 5; 
  bool rc = file.Write3dmChunkVersion(1,minor_version);
  if (rc) 
  {
    if (rc) rc = file.WriteInt(m_bComputeCurvature);
    if (rc) rc = file.WriteInt(m_bSimplePlanes);
    if (rc) rc = file.WriteInt(m_bRefine);
    if (rc) rc = file.WriteInt(m_bJaggedSeams);
    if (rc) rc = file.WriteInt(0); // obsolete m_bWeld field
    if (rc) rc = file.WriteDouble(m_tolerance);
    if (rc) rc = file.WriteDouble(m_min_edge_length);
    if (rc) rc = file.WriteDouble(m_max_edge_length);
    if (rc) rc = file.WriteDouble(m_grid_aspect_ratio);
    if (rc) rc = file.WriteInt(m_grid_min_count);
    if (rc) rc = file.WriteInt(m_grid_max_count);
    if (rc) rc = file.WriteDouble(m_grid_angle_radians);
    if (rc) rc = file.WriteDouble(m_grid_amplification);
    if (rc) rc = file.WriteDouble(m_refine_angle_radians);
    if (rc) rc = file.WriteDouble(5.0*ON_PI/180.0); // obsolete m_combine_angle field
    int mft = m_face_type;
    if ( mft < 0 || mft > 2 ) 
    {
      ON_ERROR("ON_MeshParameters::Write() - m_face_type out of bounds.");
      mft = 0;
    }
    if (rc) rc = file.WriteInt(mft);

    // added for chunk version 1.1
    if (rc) rc = file.WriteInt( m_texture_range );

    // added for chunk version 1.2 - 14 October 2005
    if (rc) rc = file.WriteBool( m_bCustomSettings );
    if (rc) rc = file.WriteDouble( m_relative_tolerance );
    // DO NOT SAVE m_min_tolerance - yet ??

    // added for chunk version 1.3 - 20 February 2006
    if (rc) rc = file.WriteChar(m_mesher);

    // added for chunk version 1.4 - 3 March 2011
    if (rc) rc = file.WriteBool( m_bCustomSettingsEnabled );

    if (rc)
    {
      // added for chunk version 1.5 - June 19, 2020
      const ON_SubDDisplayParameters subdp = SubDDisplayParameters();
      rc = subdp.Write(file);
    }
  }
  return rc;
}